

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void dd_simplify_fname_c(char *s)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  char *in_RDI;
  int e_1;
  int j;
  int e;
  int qs;
  bool ok;
  char *semi;
  int len;
  int i;
  int local_3c;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  bool local_19;
  void *local_18;
  int local_10;
  int local_c;
  char *local_8;
  
  if (in_RDI != (char *)0x0) {
    local_8 = in_RDI;
    sVar4 = strlen(in_RDI);
    local_10 = (int)sVar4;
    local_3c = local_10;
    if (8 < local_10) {
      local_3c = 8;
    }
    local_18 = memchr(local_8,0x3a,(long)local_3c);
    if ((((local_18 != (void *)0x0) && ((long)local_18 + (3 - (long)local_8) < (long)local_10)) &&
        (*(char *)((long)local_18 + 1) == '/')) && (*(char *)((long)local_18 + 2) == '/')) {
      local_10 = local_10 - (((int)local_18 + 3) - (int)local_8);
      local_8 = (char *)((long)local_18 + 3);
    }
    do {
      local_19 = false;
      for (local_c = 0;
          (local_c < local_10 &&
          (((local_8[local_c] == ' ' || (local_8[local_c] == '\t')) ||
           ((local_8[local_c] == '\n' || (local_8[local_c] == '\r')))))); local_c = local_c + 1) {
      }
      bVar1 = 0 < local_c;
      iVar3 = local_10;
      if (bVar1) {
        local_10 = local_10 - local_c;
        memmove(local_8,local_8 + local_c,(long)(local_10 + 1));
        iVar3 = local_10;
      }
      do {
        iVar2 = iVar3;
        local_c = iVar2 + -1;
        if (local_c < 0) break;
        iVar3 = local_c;
      } while (((local_8[local_c] == ' ') || (iVar3 = local_c, local_8[local_c] == '\t')) ||
              ((iVar3 = local_c, local_8[local_c] == '\n' ||
               (iVar3 = local_c, local_8[local_c] == '\r'))));
      local_19 = local_c < local_10 + -1;
      if (local_19) {
        local_8[iVar2] = '\0';
        local_10 = iVar2;
      }
      local_19 = local_19 || bVar1;
      for (local_c = 0; (iVar3 = local_c, local_c < local_10 && (local_8[local_c] != '\"'));
          local_c = local_c + 1) {
      }
      if (local_c < local_10) {
        local_20 = local_c;
        do {
          local_c = local_c + 1;
          if (local_10 <= local_c) break;
        } while (local_8[local_c] != '\"');
        if (local_c < local_10) {
          memmove(local_8 + iVar3,local_8 + (long)iVar3 + 1,(long)(local_10 - iVar3));
          local_10 = local_10 + -1;
          local_c = local_c + -1;
          memmove(local_8 + local_c,local_8 + (long)local_c + 1,(long)(local_10 - local_c));
          local_10 = local_10 + -1;
          local_19 = true;
        }
      }
    } while (local_19 != false);
    for (local_c = 1; local_c < local_10; local_c = local_c + 1) {
      if (local_8[local_c] == '\\') {
        local_8[local_c] = '/';
      }
    }
    for (local_c = 1; local_c < local_10; local_c = local_c + 1) {
      if ((local_8[local_c] == '/') && (local_8[local_c + -1] == '/')) {
        memmove(local_8 + local_c,local_8 + (long)local_c + 1,(long)(local_10 - local_c));
        local_10 = local_10 + -1;
        local_c = local_c + -1;
      }
    }
    while (((1 < local_10 && (*local_8 == '.')) && (local_8[1] == '/'))) {
      iVar3 = local_10 + -1;
      local_10 = local_10 + -2;
      memmove(local_8,local_8 + 2,(long)iVar3);
    }
    for (local_c = 1; local_c < local_10; local_c = local_c + 1) {
      if (((local_8[local_c] == '.') &&
          ((local_8[local_c + -1] == '/' || (local_8[local_c + -1] == ':')))) &&
         ((local_8[local_c + 1] == '/' || (local_8[local_c + 1] == '\0')))) {
        local_24 = 1;
        if (local_8[local_c + 1] == '/') {
          local_24 = 2;
        }
        local_10 = local_10 - local_24;
        memmove(local_8 + local_c,local_8 + (long)local_24 + (long)local_c,
                (long)((local_10 + 1) - local_c));
        local_c = local_c + -1;
      }
    }
    for (local_c = 2; local_c < local_10; local_c = local_c + 1) {
      if (((local_8[local_c + -2] == '/') && (local_8[local_c + -1] == '.')) &&
         ((local_8[local_c] == '.' &&
          ((local_8[local_c + 1] == '/' || (local_8[local_c + 1] == '\0')))))) {
        for (local_28 = local_c + -3;
            ((-1 < local_28 && (local_8[local_28] != '/')) && (local_8[local_28] != ':'));
            local_28 = local_28 + -1) {
        }
        iVar3 = local_28 + 1;
        if ((iVar3 < local_c + -2) &&
           (((local_2c = (local_c + 1) - iVar3, local_2c != 5 || (local_8[iVar3] != '.')) ||
            (local_8[local_28 + 2] != '.')))) {
          if (local_8[local_c + 1] == '/') {
            local_2c = local_2c + 1;
          }
          local_10 = local_10 - local_2c;
          local_28 = iVar3;
          memmove(local_8 + iVar3,local_8 + (long)local_2c + (long)iVar3,
                  (long)((local_10 + 1) - iVar3));
          local_30 = 1;
          piVar5 = std::max<int>(&local_28,&local_30);
          local_c = *piVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void dd_simplify_fname_c(char *s)
{
  if(!s) return;
  int i,len=strlen(s);

  // check for URL format to prevent removal of ://
  if (char *semi = (char*)memchr(s, ':', len > 8 ? 8 : len))
    if (len > (semi+3-s) && semi[1] == '/' && semi[2] == '/')
    {
      len -= int(semi+3-s);
      s = semi+3;
    }

  for(;;) {
    bool ok=false;
    // remove leading spaces
    for(i=0;i<len;++i)
      if(s[i]!=' ' && s[i]!='\t' && s[i]!='\n' && s[i]!='\r') break;
    if(i>0) {len-=i;memmove(s,s+i,len+1); ok=true;}
    // remove trailing spaces
    for(i=len-1;i>=0;--i)
      if(s[i]!=' ' && s[i]!='\t' && s[i]!='\n' && s[i]!='\r') break;
    if(i<len-1) {s[len=i+1]=0; ok=true;}
    // remove quotes
    for(i=0;i<len;++i) if(s[i]=='"') break;
    if(i<len) {
      int qs=i;
      for(++i;i<len;++i) if(s[i]=='"') break;
      if(i<len) {
        memmove(s+qs,s+qs+1,len-qs); --len; --i;
        memmove(s+i,s+i+1,len-i); --len;
        ok=true;
      }
    }
    if(!ok) break;
  }

  // replace all back slashes with normal ones
  for(i=1;i<len;++i)
    if(s[i]==PATH_DELIM_BACK )
      s[i]=PATH_DELIM;

  // remove extra slashes
  for(i=1;i<len;++i) if(s[i]==PATH_DELIM)
    if(s[i-1]==PATH_DELIM)
      {memmove(s+i,s+i+1,len-i); --len; --i;}

  // remove extra cur-dirs
  while (len>1)
    if (s[0]=='.' && s[1]==PATH_DELIM)
    {
      len-=2;
      memmove(s,s+2,len+1);
    }
    else
      break;

  for(i=1;i<len;++i) if(s[i]=='.' && (s[i-1]==PATH_DELIM || s[i-1]==':'))
    if(s[i+1]==PATH_DELIM || s[i+1]==0) {
      int e=1; if(s[i+1]==PATH_DELIM) ++e;
      len-=e; memmove(s+i,s+i+e,len+1-i);
      --i;
    }

  // remove extra up-dirs
  for (i=2; i<len; ++i) if (s[i-2]==PATH_DELIM && s[i-1]=='.' && s[i]=='.')
    if (s[i+1]==PATH_DELIM || s[i+1]==0)
    {
      int j;
      for (j=i-3;j>=0;--j) if(s[j]==PATH_DELIM || s[j]==':') break;

      if (++j<i-2)
      {
        int e=i+1-j;

        if (e!=5 || s[j]!='.' || s[j+1]!='.')
        {
          if (s[i+1]==PATH_DELIM) ++e;

          len-=e; memmove(s+j, s+j+e, len+1-j);
          i=std::max(j,1);
        }
      }
    }
}